

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceObjectArchive::Merge(DeviceObjectArchive *this,DeviceObjectArchive *Src)

{
  uint *__last;
  uint uVar1;
  undefined *puVar2;
  TPointer __first;
  bool bVar3;
  bool bVar4;
  ResourceType _Type;
  undefined8 uVar5;
  IMemoryAllocator *Allocator_00;
  value_type *pvVar6;
  const_reference this_00;
  reference this_01;
  size_type sVar7;
  reference pvVar8;
  size_type sVar9;
  reference this_02;
  pointer ppVar10;
  reference this_03;
  Char *pCVar11;
  char (*Args_1) [14];
  allocator<unsigned_int> *this_04;
  char *in_R8;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>,_bool>
  pVar12;
  char (*in_stack_fffffffffffffb78) [3];
  undefined1 local_400 [8];
  string msg_4;
  string msg_3;
  undefined1 local_3b0 [8];
  Serializer<(Diligent::SerializerMode)1> Ser_3;
  uint *Idx;
  iterator __end6;
  iterator __begin6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range6;
  undefined1 local_370 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> NewIndices;
  string msg_2;
  Serializer<(Diligent::SerializerMode)0> Ser_2;
  ShaderIndexArray ShaderIndices;
  string msg_1;
  Serializer<(Diligent::SerializerMode)1> Ser_1;
  string msg;
  Serializer<(Diligent::SerializerMode)0> Ser;
  Uint32 ShaderIndex;
  value_type *DeviceData;
  ulong uStack_288;
  value_type BaseIdx;
  size_t i_1;
  undefined1 local_278 [6];
  bool IsPipeline;
  bool IsStandaloneShader;
  string _msg_1;
  ResourceData local_248;
  NamedResourceKey local_148;
  _Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
  local_130;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>,_bool>
  it_inserted;
  char *ResName;
  ResourceType ResType;
  value_type *src_res_it;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
  *__range1;
  reference local_d0;
  SerializedData *SrcShader;
  const_iterator __end2;
  const_iterator __begin2;
  value_type *__range2;
  value_type *DstShaders;
  value_type *SrcShaders;
  size_t i;
  array<unsigned_int,_7UL> ShaderBaseIndices;
  DynamicLinearAllocator DynAllocator;
  IMemoryAllocator *Allocator;
  undefined1 local_38 [8];
  string _msg;
  DeviceObjectArchive *Src_local;
  DeviceObjectArchive *this_local;
  
  _msg.field_2._8_8_ = Src;
  if (this->m_ContentVersion != Src->m_ContentVersion) {
    in_R8 = (char *)&Src->m_ContentVersion;
    FormatString<char[51],unsigned_int,char[6],unsigned_int,char[3]>
              ((string *)local_38,(Diligent *)"Merging archives with different content versions (",
               (char (*) [51])&this->m_ContentVersion,(uint *)0xd2e8ea,(char (*) [6])in_R8,
               (uint *)0xccce78,in_stack_fffffffffffffb78);
    puVar2 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar5 = std::__cxx11::string::c_str();
      in_R8 = (char *)0x0;
      (*(code *)puVar2)(1,uVar5,0);
    }
    std::__cxx11::string::~string((string *)local_38);
  }
  Allocator_00 = GetRawAllocator();
  DynamicLinearAllocator::DynamicLinearAllocator
            ((DynamicLinearAllocator *)(ShaderBaseIndices._M_elems + 5),Allocator_00,0x200);
  memset((void *)((long)&i + 4),0,0x1c);
  for (SrcShaders = (value_type *)0x0;
      pvVar6 = (value_type *)
               std::
               array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
               ::size(&this->m_DeviceShaders), uVar5 = _msg.field_2._8_8_, SrcShaders < pvVar6;
      SrcShaders = (value_type *)
                   ((long)&(SrcShaders->
                           super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1)) {
    this_00 = std::
              array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
              ::operator[]((array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
                            *)(_msg.field_2._8_8_ + 0x38),(size_type)SrcShaders);
    this_01 = std::
              array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
              ::operator[](&this->m_DeviceShaders,(size_type)SrcShaders);
    sVar7 = std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::size
                      (this_01);
    pvVar8 = std::array<unsigned_int,_7UL>::operator[]
                       ((array<unsigned_int,_7UL> *)((long)&i + 4),(size_type)SrcShaders);
    *pvVar8 = (value_type)sVar7;
    bVar3 = std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::empty
                      (this_00);
    if (!bVar3) {
      sVar7 = std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::size
                        (this_01);
      sVar9 = std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::size
                        (this_00);
      std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::reserve
                (this_01,sVar7 + sVar9);
      __end2 = std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::
               begin(this_00);
      SrcShader = (SerializedData *)
                  std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::
                  end(this_00);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_Diligent::SerializedData_*,_std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>_>
                                         *)&SrcShader), bVar3) {
        local_d0 = __gnu_cxx::
                   __normal_iterator<const_Diligent::SerializedData_*,_std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>_>
                   ::operator*(&__end2);
        SerializedData::MakeCopy((SerializedData *)&__range1,local_d0,Allocator_00);
        std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::
        emplace_back<Diligent::SerializedData>(this_01,(SerializedData *)&__range1);
        SerializedData::~SerializedData((SerializedData *)&__range1);
        __gnu_cxx::
        __normal_iterator<const_Diligent::SerializedData_*,_std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>_>
        ::operator++(&__end2);
      }
    }
  }
  __end1 = std::
           unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
           ::begin((unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
                    *)_msg.field_2._8_8_);
  src_res_it = (value_type *)
               std::
               unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
               ::end((unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
                      *)uVar5);
  while (bVar3 = std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                            ,(_Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                              *)&src_res_it), bVar3) {
    this_02 = std::__detail::
              _Node_const_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
              ::operator*(&__end1);
    _Type = NamedResourceKey::GetType(&this_02->first);
    it_inserted._8_8_ = NamedResourceKey::GetName(&this_02->first);
    NamedResourceKey::NamedResourceKey(&local_148,_Type,(char *)it_inserted._8_8_,true);
    ResourceData::MakeCopy(&local_248,&this_02->second,Allocator_00);
    pVar12 = std::
             unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,Diligent::DeviceObjectArchive::ResourceData,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>>>
             ::
             emplace<Diligent::DeviceObjectArchive::NamedResourceKey,Diligent::DeviceObjectArchive::ResourceData>
                       ((unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,Diligent::DeviceObjectArchive::ResourceData,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>>>
                         *)this,&local_148,&local_248);
    _msg_1.field_2._8_8_ =
         pVar12.first.
         super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
         ._M_cur;
    it_inserted.first.
    super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
    ._M_cur._0_1_ = pVar12.second;
    local_130._M_cur = (__node_type *)_msg_1.field_2._8_8_;
    ResourceData::~ResourceData(&local_248);
    NamedResourceKey::~NamedResourceKey(&local_148);
    if (((byte)it_inserted.first.
               super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
               ._M_cur & 1) == 0) {
      ppVar10 = std::__detail::
                _Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
                ::operator->((_Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
                              *)&local_130);
      bVar3 = ResourceData::operator!=(&ppVar10->second,&this_02->second);
      if (bVar3) {
        FormatString<char[26],char_const*,char[47]>
                  ((string *)local_278,(Diligent *)"Failed to copy resource \'",
                   (char (*) [26])&it_inserted.second,
                   (char **)"\': resource with the same name already exists.",(char (*) [47])in_R8);
        puVar2 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar5 = std::__cxx11::string::c_str();
          in_R8 = (char *)0x0;
          (*(code *)puVar2)(1,uVar5,0);
        }
        std::__cxx11::string::~string((string *)local_278);
      }
    }
    else {
      bVar3 = true;
      if (((_Type != GraphicsPipeline) && (bVar3 = true, _Type != ComputePipeline)) &&
         (bVar3 = true, _Type != RayTracingPipeline)) {
        bVar3 = _Type == TilePipeline;
      }
      if ((_Type == StandaloneShader) || (bVar3)) {
        for (uStack_288 = 0; uStack_288 < 7; uStack_288 = uStack_288 + 1) {
          pvVar8 = std::array<unsigned_int,_7UL>::operator[]
                             ((array<unsigned_int,_7UL> *)((long)&i + 4),uStack_288);
          uVar1 = *pvVar8;
          ppVar10 = std::__detail::
                    _Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
                    ::operator->((_Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
                                  *)&local_130);
          this_03 = std::array<Diligent::SerializedData,_7UL>::operator[]
                              (&(ppVar10->second).DeviceSpecific,uStack_288);
          bVar4 = SerializedData::operator_cast_to_bool(this_03);
          if (bVar4) {
            if (_Type == StandaloneShader) {
              Ser.m_Ptr._4_4_ = 0;
              Serializer<(Diligent::SerializerMode)0>::Serializer
                        ((Serializer<(Diligent::SerializerMode)0> *)((long)&msg.field_2 + 8),this_03
                        );
              bVar4 = Serializer<(Diligent::SerializerMode)0>::operator()
                                ((Serializer<(Diligent::SerializerMode)0> *)((long)&msg.field_2 + 8)
                                 ,(uint *)((long)&Ser.m_Ptr + 4));
              if (!bVar4) {
                in_R8 = 
                "Failed to deserialize standalone shader index. Archive file may be corrupted or invalid."
                ;
                LogError<true,char[89]>
                          (false,"Merge",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                           ,0x271,(char (*) [89])
                                  "Failed to deserialize standalone shader index. Archive file may be corrupted or invalid."
                          );
              }
              bVar4 = Serializer<(Diligent::SerializerMode)0>::IsEnded
                                ((Serializer<(Diligent::SerializerMode)0> *)((long)&msg.field_2 + 8)
                                );
              if (!bVar4) {
                FormatString<char[51]>
                          ((string *)&Ser_1.m_Ptr,
                           (char (*) [51])"No other data besides the shader index is expected");
                pCVar11 = (Char *)std::__cxx11::string::c_str();
                DebugAssertionFailed
                          (pCVar11,"Merge",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                           ,0x272);
                std::__cxx11::string::~string((string *)&Ser_1.m_Ptr);
              }
              Args_1 = (char (*) [14])(ulong)uVar1;
              Ser.m_Ptr._4_4_ = Ser.m_Ptr._4_4_ + uVar1;
              Serializer<(Diligent::SerializerMode)1>::Serializer
                        ((Serializer<(Diligent::SerializerMode)1> *)((long)&msg_1.field_2 + 8),
                         this_03);
              Serializer<(Diligent::SerializerMode)1>::operator()
                        ((Serializer<(Diligent::SerializerMode)1> *)((long)&msg_1.field_2 + 8),
                         (uint *)((long)&Ser.m_Ptr + 4));
              bVar4 = Serializer<(Diligent::SerializerMode)1>::IsEnded
                                ((Serializer<(Diligent::SerializerMode)1> *)
                                 ((long)&msg_1.field_2 + 8));
              if (!bVar4) {
                FormatString<char[26],char[14]>
                          ((string *)&ShaderIndices.Count,(Diligent *)"Debug expression failed:\n",
                           (char (*) [26])0xcc16de,Args_1);
                pCVar11 = (Char *)std::__cxx11::string::c_str();
                DebugAssertionFailed
                          (pCVar11,"Merge",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                           ,0x27a);
                std::__cxx11::string::~string((string *)&ShaderIndices.Count);
              }
            }
            else if (bVar3) {
              ShaderIndexArray::ShaderIndexArray((ShaderIndexArray *)&Ser_2.m_Ptr);
              Serializer<(Diligent::SerializerMode)0>::Serializer
                        ((Serializer<(Diligent::SerializerMode)0> *)((long)&msg_2.field_2 + 8),
                         this_03);
              bVar4 = PSOSerializer<(Diligent::SerializerMode)0>::SerializeShaderIndices
                                ((Serializer<(Diligent::SerializerMode)0> *)
                                 ((long)&msg_2.field_2 + 8),
                                 (ConstQual<ShaderIndexArray> *)&Ser_2.m_Ptr,
                                 (DynamicLinearAllocator *)(ShaderBaseIndices._M_elems + 5));
              if (!bVar4) {
                in_R8 = 
                "Failed to deserialize PSO shader indices. Archive file may be corrupted or invalid."
                ;
                LogError<true,char[84]>
                          (false,"Merge",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                           ,0x284,(char (*) [84])
                                  "Failed to deserialize PSO shader indices. Archive file may be corrupted or invalid."
                          );
              }
              bVar4 = Serializer<(Diligent::SerializerMode)0>::IsEnded
                                ((Serializer<(Diligent::SerializerMode)0> *)
                                 ((long)&msg_2.field_2 + 8));
              if (!bVar4) {
                FormatString<char[49]>
                          ((string *)
                           &NewIndices.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,
                           (char (*) [49])"No other data besides shader indices is expected");
                pCVar11 = (Char *)std::__cxx11::string::c_str();
                DebugAssertionFailed
                          (pCVar11,"Merge",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                           ,0x285);
                std::__cxx11::string::~string
                          ((string *)
                           &NewIndices.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
              }
              __first = Ser_2.m_Ptr;
              __last = (uint *)(Ser_2.m_Ptr + (ulong)(uint)ShaderIndices.pIndices * 4);
              this_04 = (allocator<unsigned_int> *)((long)&__range6 + 7);
              std::allocator<unsigned_int>::allocator(this_04);
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              vector<unsigned_int_const*,void>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_370,
                         (uint *)__first,__last,this_04);
              std::allocator<unsigned_int>::~allocator
                        ((allocator<unsigned_int> *)((long)&__range6 + 7));
              __end6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_370);
              Idx = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                       local_370);
              while (bVar4 = __gnu_cxx::operator!=
                                       (&__end6,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                                 *)&Idx), bVar4) {
                Ser_3.m_Ptr = (TPointer)
                              __gnu_cxx::
                              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              ::operator*(&__end6);
                this_04 = (allocator<unsigned_int> *)(ulong)(uVar1 + *(uint *)Ser_3.m_Ptr);
                *(uint *)Ser_3.m_Ptr = uVar1 + *(uint *)Ser_3.m_Ptr;
                __gnu_cxx::
                __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator++(&__end6);
              }
              Serializer<(Diligent::SerializerMode)1>::Serializer
                        ((Serializer<(Diligent::SerializerMode)1> *)local_3b0,this_03);
              msg_3.field_2._8_8_ =
                   std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_370);
              PSOSerializer<(Diligent::SerializerMode)1>::SerializeShaderIndices
                        ((Serializer<(Diligent::SerializerMode)1> *)local_3b0,
                         (ConstQual<ShaderIndexArray> *)((long)&msg_3.field_2 + 8),
                         (DynamicLinearAllocator *)0x0);
              bVar4 = Serializer<(Diligent::SerializerMode)1>::IsEnded
                                ((Serializer<(Diligent::SerializerMode)1> *)local_3b0);
              if (!bVar4) {
                FormatString<char[26],char[14]>
                          ((string *)((long)&msg_4.field_2 + 8),
                           (Diligent *)"Debug expression failed:\n",(char (*) [26])0xcc16de,
                           (char (*) [14])this_04);
                pCVar11 = (Char *)std::__cxx11::string::c_str();
                DebugAssertionFailed
                          (pCVar11,"Merge",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                           ,0x28f);
                std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
              }
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_370);
            }
            else {
              FormatString<char[25]>((string *)local_400,(char (*) [25])"Unexpected resource type");
              pCVar11 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar11,"Merge",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                         ,0x294);
              std::__cxx11::string::~string((string *)local_400);
            }
          }
        }
      }
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
    ::operator++(&__end1);
  }
  DynamicLinearAllocator::~DynamicLinearAllocator
            ((DynamicLinearAllocator *)(ShaderBaseIndices._M_elems + 5));
  return;
}

Assistant:

void DeviceObjectArchive::Merge(const DeviceObjectArchive& Src) noexcept(false)
{
    if (m_ContentVersion != Src.m_ContentVersion)
        LOG_WARNING_MESSAGE("Merging archives with different content versions (", m_ContentVersion, " and ", Src.m_ContentVersion, ").");

    static_assert(static_cast<size_t>(ResourceType::Count) == 8, "Did you add a new resource type? You may need to handle it here.");

    auto&                  Allocator = GetRawAllocator();
    DynamicLinearAllocator DynAllocator{Allocator, 512};

    // Copy shaders
    std::array<Uint32, static_cast<size_t>(DeviceType::Count)> ShaderBaseIndices{};
    for (size_t i = 0; i < m_DeviceShaders.size(); ++i)
    {
        const auto& SrcShaders = Src.m_DeviceShaders[i];
        auto&       DstShaders = m_DeviceShaders[i];
        ShaderBaseIndices[i]   = static_cast<Uint32>(DstShaders.size());
        if (SrcShaders.empty())
            continue;
        DstShaders.reserve(DstShaders.size() + SrcShaders.size());
        for (const auto& SrcShader : SrcShaders)
            DstShaders.emplace_back(SrcShader.MakeCopy(Allocator));
    }

    // Copy named resources
    for (auto& src_res_it : Src.m_NamedResources)
    {
        const auto  ResType = src_res_it.first.GetType();
        const auto* ResName = src_res_it.first.GetName();

        auto it_inserted = m_NamedResources.emplace(NamedResourceKey{ResType, ResName, /*CopyName = */ true}, src_res_it.second.MakeCopy(Allocator));
        if (!it_inserted.second)
        {
            // Silently skip duplicate resources
            if (it_inserted.first->second != src_res_it.second)
                LOG_WARNING_MESSAGE("Failed to copy resource '", ResName, "': resource with the same name already exists.");

            continue;
        }

        const auto IsStandaloneShader = (ResType == ResourceType::StandaloneShader);
        const auto IsPipeline =
            (ResType == ResourceType::GraphicsPipeline ||
             ResType == ResourceType::ComputePipeline ||
             ResType == ResourceType::RayTracingPipeline ||
             ResType == ResourceType::TilePipeline);

        // Update shader indices
        if (IsStandaloneShader || IsPipeline)
        {
            for (size_t i = 0; i < static_cast<size_t>(DeviceType::Count); ++i)
            {
                const auto BaseIdx = ShaderBaseIndices[i];

                auto& DeviceData = it_inserted.first->second.DeviceSpecific[i];
                if (!DeviceData)
                    continue;

                if (IsStandaloneShader)
                {
                    // For shaders, device-specific data is the serialized shader bytecode index
                    Uint32 ShaderIndex = 0;
                    {
                        Serializer<SerializerMode::Read> Ser{DeviceData};
                        if (!Ser(ShaderIndex))
                            LOG_ERROR_AND_THROW("Failed to deserialize standalone shader index. Archive file may be corrupted or invalid.");
                        VERIFY(Ser.IsEnded(), "No other data besides the shader index is expected");
                    }

                    ShaderIndex += BaseIdx;

                    {
                        Serializer<SerializerMode::Write> Ser{DeviceData};
                        Ser(ShaderIndex);
                        VERIFY_EXPR(Ser.IsEnded());
                    }
                }
                else if (IsPipeline)
                {
                    // For pipelines, device-specific data is the shader index array
                    ShaderIndexArray ShaderIndices;
                    {
                        Serializer<SerializerMode::Read> Ser{DeviceData};
                        if (!PSOSerializer<SerializerMode::Read>::SerializeShaderIndices(Ser, ShaderIndices, &DynAllocator))
                            LOG_ERROR_AND_THROW("Failed to deserialize PSO shader indices. Archive file may be corrupted or invalid.");
                        VERIFY(Ser.IsEnded(), "No other data besides shader indices is expected");
                    }

                    std::vector<Uint32> NewIndices{ShaderIndices.pIndices, ShaderIndices.pIndices + ShaderIndices.Count};
                    for (auto& Idx : NewIndices)
                        Idx += BaseIdx;

                    {
                        Serializer<SerializerMode::Write> Ser{DeviceData};
                        PSOSerializer<SerializerMode::Write>::SerializeShaderIndices(Ser, ShaderIndexArray{NewIndices.data(), ShaderIndices.Count}, nullptr);
                        VERIFY_EXPR(Ser.IsEnded());
                    }
                }
                else
                {
                    UNEXPECTED("Unexpected resource type");
                }
            }
        }
    }
}